

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_manager.h
# Opt level: O1

path * __thiscall filesystem::path::parent_path(path *__return_storage_ptr__,path *this)

{
  pointer pcVar1;
  long lVar2;
  string s;
  string local_60;
  long *local_40 [2];
  long local_30 [2];
  
  lVar2 = std::__cxx11::string::rfind((char)this,0x2f);
  if (lVar2 == -1) {
    local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_60,"");
    path(__return_storage_ptr__,&local_60);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_60._M_dataplus._M_p == &local_60.field_2) {
      return __return_storage_ptr__;
    }
  }
  else {
    pcVar1 = (this->path_)._M_dataplus._M_p;
    local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_60,pcVar1,pcVar1 + (this->path_)._M_string_length);
    std::__cxx11::string::substr((ulong)local_40,(ulong)&local_60);
    std::__cxx11::string::operator=((string *)&local_60,(string *)local_40);
    if (local_40[0] != local_30) {
      operator_delete(local_40[0],local_30[0] + 1);
    }
    path(__return_storage_ptr__,&local_60);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_60._M_dataplus._M_p == &local_60.field_2) {
      return __return_storage_ptr__;
    }
  }
  operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
  return __return_storage_ptr__;
}

Assistant:

path parent_path() const
    {
        std::size_t found = this->path_.find_last_of(separator_);
        if (found != std::string::npos) {
            // Separator found
            std::string s(this->path_);
            s = s.substr(0, found);
            return path(s);
        }
        else {
            return path("");
        }
    }